

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::Module::removeTables(Module *this,function<bool_(wasm::Table_*)> *pred)

{
  function<bool_(wasm::Table_*)> local_38;
  function<bool_(wasm::Table_*)> *local_18;
  function<bool_(wasm::Table_*)> *pred_local;
  Module *this_local;
  
  local_18 = pred;
  pred_local = (function<bool_(wasm::Table_*)> *)this;
  std::function<bool_(wasm::Table_*)>::function(&local_38,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>,std::unordered_map<wasm::Name,wasm::Table*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Table*>>>,wasm::Table>
            (&this->tables,&this->tablesMap,&local_38);
  std::function<bool_(wasm::Table_*)>::~function(&local_38);
  return;
}

Assistant:

void Module::removeTables(std::function<bool(Table*)> pred) {
  removeModuleElements(tables, tablesMap, pred);
}